

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::VectorDeathTest_BoundsChecks_Test::~VectorDeathTest_BoundsChecks_Test
          (VectorDeathTest_BoundsChecks_Test *this)

{
  VectorDeathTest_BoundsChecks_Test *this_local;
  
  ~VectorDeathTest_BoundsChecks_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VectorDeathTest, BoundsChecks) {
  Vector<int> vec;
  EXPECT_DEATH_IF_SUPPORTED(vec.front(), "");
  EXPECT_DEATH_IF_SUPPORTED(vec.back(), "");
  EXPECT_DEATH_IF_SUPPORTED(vec.pop_back(), "");
  ASSERT_TRUE(vec.Push(1));
  // Within bounds of the capacity, but not the vector.
  EXPECT_DEATH_IF_SUPPORTED(vec[1], "");
  // Not within bounds of the capacity either.
  EXPECT_DEATH_IF_SUPPORTED(vec[10000], "");
}